

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testInit
          (VaryingLocationAliasingWithMixedInterpolationTest *this)

{
  pointer *pptVar1;
  iterator iVar2;
  Type TVar3;
  Type TVar4;
  VaryingLocationAliasingWithMixedInterpolationTest *this_00;
  uint uVar5;
  GLuint GVar6;
  GLuint index;
  GLuint index_00;
  TYPES TVar7;
  GLuint int_gohan;
  INTERPOLATIONS IVar8;
  GLuint stage;
  STAGES SVar9;
  GLuint int_goten;
  INTERPOLATIONS IVar10;
  Type TVar11;
  Type TVar12;
  testCase local_90;
  testCase local_60;
  
  TVar3.m_n_rows = local_60.m_type_gohan.m_n_rows;
  TVar3._0_8_ = local_60.m_type_gohan._0_8_;
  index_00 = 0;
  this_00 = this;
  do {
    local_60.m_type_gohan = TVar3;
    TVar11 = TestBase::getType((TestBase *)this_00,index_00);
    uVar5 = TVar11.m_n_rows;
    this_00 = TVar11._0_8_;
    TVar3 = local_60.m_type_gohan;
    if (((ulong)this_00 & 0xffffffff00000000) == 0x100000000) {
      index = 0;
      do {
        local_60.m_type_gohan = TVar3;
        TVar12 = TestBase::getType((TestBase *)this_00,index);
        GVar6 = TVar12.m_n_rows;
        TVar7 = TVar12.m_basic_type;
        TVar3 = local_60.m_type_gohan;
        if ((((TVar12._0_8_ & 0xffffffff00000000) == 0x100000000) &&
            (TVar11.m_basic_type < Int == TVar7 < Int)) && (GVar6 + uVar5 < 5)) {
          SVar9 = COMPUTE;
          do {
            if (SVar9 != COMPUTE) {
              IVar8 = SMOOTH;
              do {
                IVar10 = SMOOTH;
                do {
                  if (IVar8 != IVar10) {
                    local_60.m_component_gohan = 0;
                    local_60.m_is_input = true;
                    local_60.m_type_goten.m_n_columns = TVar12.m_n_columns;
                    local_90.m_component_gohan = 0;
                    local_90._16_4_ = local_90._16_4_ & 0xffffff00;
                    local_90.m_interpolation_gohan = IVar8;
                    local_90.m_interpolation_goten = IVar10;
                    local_90.m_stage = SVar9;
                    local_90.m_type_goten.m_basic_type = TVar7;
                    local_90.m_type_goten.m_n_columns = local_60.m_type_goten.m_n_columns;
                    local_90.m_type_goten.m_n_rows = GVar6;
                    local_60.m_component_goten = uVar5;
                    local_60.m_interpolation_gohan = IVar8;
                    local_60.m_interpolation_goten = IVar10;
                    local_60.m_stage = SVar9;
                    local_60.m_type_gohan.m_n_rows = uVar5;
                    local_60.m_type_goten.m_basic_type = TVar7;
                    local_60.m_type_goten.m_n_rows = GVar6;
                    local_90.m_type_gohan = TVar11;
                    TVar4 = TVar11;
                    if (SVar9 == VERTEX) {
LAB_00898173:
                      local_90.m_component_goten = TVar4.m_n_rows;
                      local_60.m_type_gohan._0_8_ = TVar4._0_8_;
                      TVar3.m_n_rows = local_60.m_type_gohan.m_n_rows;
                      TVar3.m_basic_type = local_60.m_type_gohan.m_basic_type;
                      TVar3.m_n_columns = local_60.m_type_gohan.m_n_columns;
                      iVar2._M_current =
                           (this->m_test_cases).
                           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar2._M_current ==
                          (this->m_test_cases).
                          super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::
                        vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>>
                        ::
                        _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase_const&>
                                  ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>>
                                    *)&this->m_test_cases,iVar2,&local_90);
                        TVar3.m_n_rows = local_60.m_type_gohan.m_n_rows;
                        TVar3.m_basic_type = local_60.m_type_gohan.m_basic_type;
                        TVar3.m_n_columns = local_60.m_type_gohan.m_n_columns;
                      }
                      else {
                        *(ulong *)&((iVar2._M_current)->m_type_gohan).m_n_rows =
                             CONCAT44(local_90.m_type_goten.m_basic_type,
                                      local_90.m_type_gohan.m_n_rows);
                        ((iVar2._M_current)->m_type_goten).m_n_columns =
                             local_90.m_type_goten.m_n_columns;
                        ((iVar2._M_current)->m_type_goten).m_n_rows = local_90.m_type_goten.m_n_rows
                        ;
                        (iVar2._M_current)->m_is_input = (bool)local_90.m_is_input;
                        *(int3 *)&(iVar2._M_current)->field_0x11 = local_90._17_3_;
                        (iVar2._M_current)->m_stage = local_90.m_stage;
                        ((iVar2._M_current)->m_type_gohan).m_basic_type =
                             local_90.m_type_gohan.m_basic_type;
                        ((iVar2._M_current)->m_type_gohan).m_n_columns =
                             local_90.m_type_gohan.m_n_columns;
                        (iVar2._M_current)->m_component_gohan = local_90.m_component_gohan;
                        (iVar2._M_current)->m_component_goten = local_90.m_component_goten;
                        (iVar2._M_current)->m_interpolation_gohan = local_90.m_interpolation_gohan;
                        (iVar2._M_current)->m_interpolation_goten = local_90.m_interpolation_goten;
                        pptVar1 = &(this->m_test_cases).
                                   super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *pptVar1 = *pptVar1 + 1;
                      }
                    }
                    else {
                      local_90.m_component_goten = uVar5;
                      TVar3 = TVar11;
                      if ((SVar9 != FRAGMENT) ||
                         ((TVar7 != Double || IVar10 == FLAT) &&
                          (IVar8 == FLAT || TVar11.m_basic_type != Double))) {
                        iVar2._M_current =
                             (this->m_test_cases).
                             super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if (iVar2._M_current ==
                            (this->m_test_cases).
                            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          local_60.m_type_gohan = TVar11;
                          std::
                          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>>
                          ::
                          _M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase_const&>
                                    ((vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>>
                                      *)&this->m_test_cases,iVar2,&local_60);
                          TVar3 = local_60.m_type_gohan;
                        }
                        else {
                          *(ulong *)&((iVar2._M_current)->m_type_gohan).m_n_rows =
                               CONCAT44(TVar7,uVar5);
                          ((iVar2._M_current)->m_type_goten).m_n_columns = (int)TVar12._4_8_;
                          ((iVar2._M_current)->m_type_goten).m_n_rows =
                               (int)((ulong)TVar12._4_8_ >> 0x20);
                          (iVar2._M_current)->m_is_input = true;
                          *(undefined3 *)&(iVar2._M_current)->field_0x11 = local_60._17_3_;
                          (iVar2._M_current)->m_stage = SVar9;
                          *(VaryingLocationAliasingWithMixedInterpolationTest **)
                           &(iVar2._M_current)->m_type_gohan = this_00;
                          (iVar2._M_current)->m_component_gohan = (int)((ulong)uVar5 << 0x20);
                          (iVar2._M_current)->m_component_goten =
                               (int)(((ulong)uVar5 << 0x20) >> 0x20);
                          (iVar2._M_current)->m_interpolation_gohan = IVar8;
                          (iVar2._M_current)->m_interpolation_goten = IVar10;
                          pptVar1 = &(this->m_test_cases).
                                     super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *pptVar1 = *pptVar1 + 1;
                        }
                        local_60.m_type_gohan.m_n_rows = TVar3.m_n_rows;
                        local_60.m_type_gohan._0_8_ = TVar3._0_8_;
                        TVar4.m_n_rows = local_90.m_component_goten;
                        TVar4.m_basic_type = local_60.m_type_gohan.m_basic_type;
                        TVar4.m_n_columns = local_60.m_type_gohan.m_n_columns;
                        if (SVar9 != FRAGMENT) goto LAB_00898173;
                      }
                    }
                  }
                  IVar10 = IVar10 + FLAT;
                } while (IVar10 != INTERPOLATION_MAX);
                IVar8 = IVar8 + FLAT;
              } while (IVar8 != INTERPOLATION_MAX);
            }
            SVar9 = SVar9 + VERTEX;
          } while (SVar9 != STAGE_MAX);
        }
        index = index + 1;
      } while (index != 0x22);
    }
    index_00 = index_00 + 1;
    if (index_00 == 0x22) {
      return;
    }
  } while( true );
}

Assistant:

void VaryingLocationAliasingWithMixedInterpolationTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip invalid combinations */
			if (is_float_type_gohan != is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				/* Skip compute shader */
				if (Utils::Shader::COMPUTE == stage)
				{
					continue;
				}

				const GLuint gohan = 0;
				const GLuint goten = gohan + n_req_components_gohan;

				for (GLuint int_gohan = 0; int_gohan < INTERPOLATION_MAX; ++int_gohan)
				{
					for (GLuint int_goten = 0; int_goten < INTERPOLATION_MAX; ++int_goten)
					{
						const bool is_gohan_double = (Utils::Type::Double == type_gohan.m_basic_type) ? true : false;
						const bool is_goten_double = (Utils::Type::Double == type_goten.m_basic_type) ? true : false;
						const bool is_gohan_flat   = (FLAT == int_gohan) ? true : false;
						const bool is_goten_flat   = (FLAT == int_goten) ? true : false;
						const bool is_gohan_accepted_as_fs_in =
							(is_gohan_double && is_gohan_flat) || (!is_gohan_double);
						const bool is_goten_accepted_as_fs_in =
							(is_goten_double && is_goten_flat) || (!is_goten_double);
						const bool is_comb_accepted_as_fs_in = is_gohan_accepted_as_fs_in && is_goten_accepted_as_fs_in;

						/* Skip when both are the same */
						if (int_gohan == int_goten)
						{
							continue;
						}

						testCase test_case_in = { gohan,
												  goten,
												  (INTERPOLATIONS)int_gohan,
												  (INTERPOLATIONS)int_goten,
												  true,
												  (Utils::Shader::STAGES)stage,
												  type_gohan,
												  type_goten };

						testCase test_case_out = { gohan,
												   goten,
												   (INTERPOLATIONS)int_gohan,
												   (INTERPOLATIONS)int_goten,
												   false,
												   (Utils::Shader::STAGES)stage,
												   type_gohan,
												   type_goten };

						/* Skip inputs in:
						 * vertex shader,
						 * fragment shader when not flat double is used
						 */
						if ((Utils::Shader::VERTEX != stage) &&
							((Utils::Shader::FRAGMENT != stage) || (true == is_comb_accepted_as_fs_in)))
						{
							m_test_cases.push_back(test_case_in);
						}

						/* Skip outputs in fragment shader */
						if (Utils::Shader::FRAGMENT != stage)
						{
							m_test_cases.push_back(test_case_out);
						}
					}
				}
			}
		}
	}
}